

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

SUNErrCode format_convert(SUNMatrix A,SUNMatrix B)

{
  long *plVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  
  pvVar3 = A->content;
  iVar2 = *(int *)((long)pvVar3 + 0x28);
  pvVar10 = B->content;
  if (iVar2 == *(int *)((long)pvVar10 + 0x28)) {
    lVar17 = *(long *)(*(long *)((long)A->content + 0x38) + *(long *)((long)A->content + 0x18) * 8);
    if (*(long *)((long)B->content + 0x10) < lVar17) {
      pvVar10 = realloc(*(void **)((long)B->content + 0x30),lVar17 * 8);
      pvVar3 = B->content;
      *(void **)((long)pvVar3 + 0x30) = pvVar10;
      pvVar10 = realloc(*(void **)((long)pvVar3 + 0x20),lVar17 * 8);
      pvVar3 = B->content;
      *(void **)((long)pvVar3 + 0x20) = pvVar10;
      *(long *)((long)pvVar3 + 0x10) = lVar17;
    }
    SUNMatZero_Sparse(B);
    lVar15 = 0;
    lVar16 = 0;
    if (0 < lVar17) {
      lVar16 = lVar17;
    }
    pvVar3 = A->content;
    for (; lVar16 != lVar15; lVar15 = lVar15 + 1) {
      pvVar10 = B->content;
      *(undefined8 *)(*(long *)((long)pvVar10 + 0x20) + lVar15 * 8) =
           *(undefined8 *)(*(long *)((long)pvVar3 + 0x20) + lVar15 * 8);
      *(undefined8 *)(*(long *)((long)pvVar10 + 0x30) + lVar15 * 8) =
           *(undefined8 *)(*(long *)((long)pvVar3 + 0x30) + lVar15 * 8);
    }
    for (lVar16 = 0; lVar16 < *(long *)((long)pvVar3 + 0x18); lVar16 = lVar16 + 1) {
      *(undefined8 *)(*(long *)((long)B->content + 0x38) + lVar16 * 8) =
           *(undefined8 *)(*(long *)((long)pvVar3 + 0x38) + lVar16 * 8);
    }
    *(long *)(*(long *)((long)B->content + 0x38) + *(long *)((long)pvVar3 + 0x18) * 8) = lVar17;
    return 0;
  }
  lVar17 = *(long *)((long)pvVar3 + 0x38);
  lVar16 = *(long *)((long)pvVar3 + 0x20);
  lVar15 = *(long *)((long)pvVar3 + 0x30);
  lVar19 = *(long *)((long)pvVar3 + (ulong)(iVar2 != 1) * 8);
  lVar4 = *(long *)((long)pvVar3 + (ulong)(iVar2 == 1) * 8);
  lVar5 = *(long *)((long)pvVar10 + 0x38);
  lVar6 = *(long *)((long)pvVar10 + 0x20);
  lVar7 = *(long *)((long)pvVar10 + 0x30);
  lVar13 = *(long *)(lVar17 + lVar19 * 8);
  SUNMatZero_Sparse(B);
  lVar11 = 0;
  lVar12 = 0;
  if (0 < lVar13) {
    lVar12 = lVar13;
  }
  for (; lVar12 != lVar11; lVar11 = lVar11 + 1) {
    plVar1 = (long *)(lVar5 + *(long *)(lVar15 + lVar11 * 8) * 8);
    *plVar1 = *plVar1 + 1;
  }
  lVar12 = 0;
  if (0 < lVar4) {
    lVar12 = lVar4;
  }
  lVar11 = 0;
  for (lVar18 = 0; lVar12 != lVar18; lVar18 = lVar18 + 1) {
    lVar8 = *(long *)(lVar5 + lVar18 * 8);
    *(long *)(lVar5 + lVar18 * 8) = lVar11;
    lVar11 = lVar8 + lVar11;
  }
  *(long *)(lVar5 + lVar4 * 8) = lVar13;
  lVar13 = 0;
  if (lVar19 < 1) {
    lVar19 = lVar13;
  }
  while (lVar12 = lVar13, lVar12 != lVar19) {
    for (lVar11 = *(long *)(lVar17 + lVar12 * 8); lVar13 = lVar12 + 1,
        lVar11 < *(long *)(lVar17 + (lVar12 + 1) * 8); lVar11 = lVar11 + 1) {
      lVar13 = *(long *)(lVar15 + lVar11 * 8);
      lVar18 = *(long *)(lVar5 + lVar13 * 8);
      *(long *)(lVar7 + lVar18 * 8) = lVar12;
      *(undefined8 *)(lVar6 + lVar18 * 8) = *(undefined8 *)(lVar16 + lVar11 * 8);
      plVar1 = (long *)(lVar5 + lVar13 * 8);
      *plVar1 = *plVar1 + 1;
    }
  }
  uVar14 = 0;
  for (lVar17 = 0; lVar17 <= lVar4; lVar17 = lVar17 + 1) {
    uVar9 = *(undefined8 *)(lVar5 + lVar17 * 8);
    *(undefined8 *)(lVar5 + lVar17 * 8) = uVar14;
    uVar14 = uVar9;
  }
  return (SUNErrCode)uVar14;
}

Assistant:

SUNErrCode format_convert(const SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);

  sunrealtype *Ax, *Bx;
  sunindextype *Ap, *Aj;
  sunindextype *Bp, *Bi;
  sunindextype n_row, n_col, nnz;
  sunindextype n, col, csum, row, last;

  if (SM_SPARSETYPE_S(A) == SM_SPARSETYPE_S(B))
  {
    SUNCheckCall(SUNMatCopy_Sparse(A, B));
    return SUN_SUCCESS;
  }

  Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Aj = SM_INDEXVALS_S(A);
  SUNAssert(Aj, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  n_row = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_ROWS_S(A) : SM_COLUMNS_S(A);
  n_col = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_COLUMNS_S(A) : SM_ROWS_S(A);

  Bp = SM_INDEXPTRS_S(B);
  Bi = SM_INDEXVALS_S(B);
  Bx = SM_DATA_S(B);

  nnz = Ap[n_row];

  SUNCheckCall(SUNMatZero_Sparse(B));

  /* compute number of non-zero entries per column (if CSR) or per row (if CSC)
   * of A */
  for (n = 0; n < nnz; n++) { Bp[Aj[n]]++; }

  /* cumualtive sum the nnz per column to get Bp[] */
  for (col = 0, csum = 0; col < n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = csum;
    csum += temp;
  }
  Bp[n_col] = nnz;

  for (row = 0; row < n_row; row++)
  {
    sunindextype jj;
    for (jj = Ap[row]; jj < Ap[row + 1]; jj++)
    {
      col               = Aj[jj];
      sunindextype dest = Bp[col];

      Bi[dest] = row;
      Bx[dest] = Ax[jj];

      Bp[col]++;
    }
  }

  for (col = 0, last = 0; col <= n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = last;
    last              = temp;
  }

  return SUN_SUCCESS;
}